

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

bool __thiscall
sptk::reaper::EpochTracker::ResampleAndReturnResults
          (EpochTracker *this,float resample_interval,vector<float,_std::allocator<float>_> *f0,
          vector<float,_std::allocator<float>_> *correlations)

{
  float fVar1;
  float fVar2;
  pointer pTVar3;
  pointer pfVar4;
  pointer pfVar5;
  int32_t frame;
  int32_t i;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  char *__ptr;
  long lVar11;
  long lVar12;
  size_type __n;
  int iVar13;
  size_t sStack_50;
  value_type_conflict3 local_38;
  value_type_conflict3 local_34;
  
  if ((this->sample_rate_ <= 0.0) ||
     (pTVar3 = (this->output_).
               super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->output_).
     super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
     ._M_impl.super__Vector_impl_data._M_finish == pTVar3)) {
    __ptr = "Un-initialized EpochTracker or no output_ in ResampleAndReturnF0\n";
    sStack_50 = 0x41;
  }
  else {
    if (0.0 < resample_interval) {
      iVar8 = (int)(((float)pTVar3->resid_index / this->sample_rate_ + this->endpoint_padding_) /
                    resample_interval + 0.5);
      std::vector<float,_std::allocator<float>_>::resize(f0,0);
      std::vector<float,_std::allocator<float>_>::resize(correlations,0);
      __n = (size_type)iVar8;
      local_34 = 0.0;
      std::vector<float,_std::allocator<float>_>::insert
                (f0,(const_iterator)
                    (f0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start,__n,&local_34);
      local_38 = 0.0;
      std::vector<float,_std::allocator<float>_>::insert
                (correlations,
                 (const_iterator)
                 (correlations->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start,__n,&local_38);
      pTVar3 = (this->output_).
               super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (int)((ulong)((long)(this->output_).
                                  super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) >> 4) -
              1;
      lVar7 = (long)(int)uVar6 << 4;
      iVar13 = 0;
      while( true ) {
        fVar1 = *(float *)((long)&pTVar3->nccf_value + lVar7);
        fVar2 = *(float *)((long)&pTVar3->f0 + lVar7);
        if ((int)uVar6 < 0) break;
        uVar9 = (ulong)uVar6;
        lVar7 = uVar9 * 0x10;
        iVar10 = (int)((float)pTVar3[uVar9].resid_index / (this->sample_rate_ * resample_interval) +
                      0.5);
        if (iVar8 <= iVar10) {
          iVar10 = iVar8 + -1;
        }
        lVar11 = (long)iVar10;
        pfVar4 = (f0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar4[lVar11] = pTVar3[uVar9].f0;
        pfVar5 = (correlations->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar5[lVar11] = pTVar3[uVar9].nccf_value;
        if (1 < iVar10 - iVar13) {
          lVar12 = (long)iVar13;
          while (lVar12 = lVar12 + 1, lVar12 < lVar11) {
            pfVar4[lVar12] = fVar2;
            pfVar5[lVar12] = fVar1;
          }
        }
        uVar6 = uVar6 - 1;
        iVar13 = iVar10;
      }
      for (lVar7 = (long)iVar13; lVar7 < (long)__n; lVar7 = lVar7 + 1) {
        (f0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar7] = fVar2;
        (correlations->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar7] = fVar1;
      }
      return true;
    }
    __ptr = "resample_interval <= 0.0 in ResampleAndReturnF0\n";
    sStack_50 = 0x30;
  }
  fwrite(__ptr,sStack_50,1,_stderr);
  return false;
}

Assistant:

bool EpochTracker::ResampleAndReturnResults(float resample_interval,
                                            std::vector<float>* f0,
                                            std::vector<float>* correlations) {
  if ((sample_rate_ <= 0.0) || (output_.size() == 0)) {
    fprintf(stderr, 
            "Un-initialized EpochTracker or no output_ in ResampleAndReturnF0\n");
    return false;
  }
  if (resample_interval <= 0.0) {
    fprintf(stderr, "resample_interval <= 0.0 in ResampleAndReturnF0\n");
    return false;
  }
  float last_time = (output_[0].resid_index / sample_rate_) + endpoint_padding_;
  int32_t n_frames = RoundUp(last_time / resample_interval);
  f0->resize(0);
  correlations->resize(0);
  f0->insert(f0->begin(), n_frames, 0.0);
  correlations->insert(correlations->begin(), n_frames, 0.0);
  int32_t limit = output_.size() - 1;
  int32_t prev_frame = 0;
  float prev_f0 = output_[limit].f0;
  float prev_corr = output_[limit].nccf_value;
  for (int32_t i = limit; i >= 0; --i) {
    int32_t frame = RoundUp(output_[i].resid_index /
                            (sample_rate_ * resample_interval));
#if 1
    if (frame >= n_frames) {
      frame = n_frames - 1;
    }
#endif
    (*f0)[frame] = output_[i].f0;
    (*correlations)[frame] = output_[i].nccf_value;
    if ((frame - prev_frame) > 1) {
      for (int32_t fr = prev_frame + 1; fr < frame; ++fr) {
        (*f0)[fr] = prev_f0;
        (*correlations)[fr] = prev_corr;
      }
    }
    prev_frame = frame;
    prev_corr = output_[i].nccf_value;
    prev_f0 = output_[i].f0;
  }
  for (int32_t frame = prev_frame; frame < n_frames; ++frame) {
    (*f0)[frame] = prev_f0;
    (*correlations)[frame] = prev_corr;
  }
  return true;
}